

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O3

longlong __thiscall
ValueExtractor<long_long>::operator()(ValueExtractor<long_long> *this,char *param_1)

{
  runtime_error *this_00;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  undefined1 *local_278 [2];
  undefined1 local_268 [16];
  char *local_258 [2];
  undefined **local_248;
  undefined1 *local_240;
  long local_238;
  undefined8 local_230;
  undefined1 local_228 [504];
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_258[0] = _munmap + (*_munmap == '*');
  local_238 = 0;
  local_248 = &PTR_grow_0017df90;
  local_230 = 500;
  format_str.size_ = 0xf;
  format_str.data_ = "invalid type {}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_258;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char_const*>
                ::TYPES;
  local_240 = local_228;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_248,format_str,args,(locale_ref)0x0);
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,local_240,local_240 + local_238);
  local_248 = &PTR_grow_0017df90;
  if (local_240 != local_228) {
    operator_delete(local_240);
  }
  std::runtime_error::runtime_error(this_00,(string *)local_278);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FMT_NORETURN T operator()(U) {
    throw std::runtime_error(fmt::format("invalid type {}", typeid(U).name()));
  }